

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O2

void __thiscall
IGNOREUnitTestMacros_CHECK_COMPAREWorksInAnIgnoredTest_Test::testBody
          (IGNOREUnitTestMacros_CHECK_COMPAREWorksInAnIgnoredTest_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString conditionString;
  SimpleString local_20;
  
  SimpleString::SimpleString(&conditionString,"");
  StringFrom((int)&local_20);
  SimpleString::operator+=(&conditionString,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::operator+=(&conditionString," ");
  SimpleString::operator+=(&conditionString,">");
  SimpleString::operator+=(&conditionString," ");
  StringFrom((int)&local_20);
  SimpleString::operator+=(&conditionString,&local_20);
  SimpleString::~SimpleString(&local_20);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString(&conditionString);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x19])
            (pUVar1,0,"CHECK_COMPARE",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x196,pTVar3);
  SimpleString::~SimpleString(&conditionString);
  return;
}

Assistant:

IGNORE_TEST(UnitTestMacros, CHECK_COMPAREWorksInAnIgnoredTest)
{
  CHECK_COMPARE(1, >, 2); // LCOV_EXCL_LINE
}